

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_recv(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  CURLcode CVar2;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  
  _Var1 = Curl_is_in_callback(data);
  if (_Var1) {
    CVar2 = CURLE_RECURSIVE_API_CALL;
  }
  else {
    CVar2 = easy_connection(data,&sfd,&c);
    if (CVar2 == CURLE_OK) {
      *n = 0;
      CVar2 = Curl_read(c,sfd,(char *)buffer,buflen,&n1);
      if (CVar2 == CURLE_OK) {
        *n = n1;
        CVar2 = CURLE_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_recv(struct Curl_easy *data, void *buffer, size_t buflen,
                        size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c;

  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  *n = 0;
  result = Curl_read(c, sfd, buffer, buflen, &n1);

  if(result)
    return result;

  *n = (size_t)n1;

  return CURLE_OK;
}